

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_diag_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_trace_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  parasail_result_t *ppVar7;
  int64_t *ptr;
  int64_t *ptr_00;
  uint uVar8;
  int iVar9;
  int64_t iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int64_t *piVar20;
  int64_t *piVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  __m128i_64_t B_2;
  __m128i_64_t A_1;
  long lVar32;
  ulong uVar34;
  undefined1 auVar33 [16];
  ulong uVar35;
  undefined1 auVar36 [16];
  long lVar37;
  long lVar38;
  long lVar39;
  __m128i_64_t B;
  ulong uVar41;
  undefined1 auVar40 [16];
  __m128i_64_t A;
  undefined1 auVar42 [16];
  long lVar43;
  __m128i_64_t B_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int64_t *local_1e8;
  ulong uStack_1b0;
  undefined1 local_1a8 [16];
  long local_190;
  long local_188;
  ulong local_180;
  long *local_178;
  parasail_result_t *local_170;
  long local_168;
  ulong uStack_160;
  undefined1 local_158 [16];
  int local_148;
  undefined4 uStack_144;
  long lStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  long local_f8;
  ulong local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  int64_t *local_c8;
  int64_t *local_c0;
  int *local_b8;
  int *local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  int local_58;
  undefined4 uStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  long local_48;
  long lStack_40;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_trace_diag_sse2_128_64_cold_7();
  }
  else {
    uVar19 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_trace_diag_sse2_128_64_cold_6();
    }
    else if (open < 0) {
      parasail_sw_trace_diag_sse2_128_64_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_trace_diag_sse2_128_64_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_trace_diag_sse2_128_64_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_trace_diag_sse2_128_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_trace_diag_sse2_128_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      local_138._8_8_ = local_138._0_8_;
      local_138._0_8_ = _s2;
      iVar6 = matrix->min;
      uStack_144 = 0;
      uVar12 = 0x8000000000000000 - (long)iVar6;
      if (iVar6 != -open && SBORROW4(iVar6,-open) == iVar6 + open < 0) {
        uVar12 = (ulong)(uint)open | 0x8000000000000000;
      }
      lVar14 = uVar12 + 1;
      iVar6 = matrix->max;
      auVar23._8_4_ = (int)lVar14;
      auVar23._0_8_ = lVar14;
      auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
      local_1a8 = auVar23;
      local_148 = open;
      local_128 = auVar23;
      local_108 = auVar23;
      ppVar7 = parasail_result_new_trace(_s1Len,s2Len,0x10,1);
      if (ppVar7 != (parasail_result_t *)0x0) {
        ppVar7->flag = ppVar7->flag | 0x2881004;
        uVar11 = (ulong)(s2Len + 2);
        local_f0 = uVar12;
        ptr = parasail_memalign_int64_t(0x10,uVar11);
        ptr_00 = parasail_memalign_int64_t(0x10,uVar11);
        local_178 = parasail_memalign_int64_t(0x10,uVar11);
        if (local_178 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
          local_180 = (long)_s1Len;
          if (matrix->type == 0) {
            local_1e8 = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
            if (local_1e8 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar1 = matrix->mapper;
              uVar12 = 0;
              do {
                local_1e8[uVar12] = (long)piVar1[(byte)_s1[uVar12]];
                uVar12 = uVar12 + 1;
              } while (local_180 != uVar12);
            }
            local_1e8[local_180] = 0;
          }
          else {
            local_1e8 = (int64_t *)0x0;
          }
          uVar4 = uStack_144;
          iVar9 = local_148;
          local_f8 = 0x7ffffffffffffffe - (long)iVar6;
          local_118._8_4_ = (int)local_f8;
          local_118._0_8_ = local_f8;
          local_118._12_4_ = (int)((ulong)local_f8 >> 0x20);
          uStack_1b0 = auVar23._8_8_;
          local_78 = uStack_1b0;
          uStack_70 = 0;
          local_58 = local_148;
          uStack_54 = uStack_144;
          iStack_50 = local_148;
          uStack_4c = uStack_144;
          local_68._0_8_ = CONCAT44(0,gap);
          local_68._8_4_ = gap;
          local_68._12_4_ = 0;
          auVar5 = local_68;
          piVar1 = matrix->mapper;
          uVar12 = 1;
          if (1 < s2Len) {
            uVar12 = uVar19;
          }
          uVar11 = 0;
          do {
            ptr[uVar11 + 1] = (long)piVar1[*(byte *)(local_138._0_8_ + uVar11)];
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
          uVar11 = 0;
          *ptr = 0;
          ptr[uVar19 + 1] = 0;
          do {
            ptr_00[uVar11 + 1] = 0;
            local_178[uVar11 + 1] = lVar14;
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
          *ptr_00 = lVar14;
          *local_178 = lVar14;
          ptr_00[uVar19 + 1] = lVar14;
          local_178[uVar19 + 1] = lVar14;
          local_170 = ppVar7;
          if (_s1Len < 1) {
            local_168 = lVar14;
            uStack_160 = uStack_1b0;
          }
          else {
            local_e8 = uVar19 * 2;
            local_188 = uVar19 - 1;
            local_158._0_12_ = ZEXT812(1);
            local_158._12_4_ = 0;
            local_190 = 0;
            uVar12 = 0;
            local_168 = lVar14;
            uStack_160 = uStack_1b0;
            local_e0 = lVar14;
            local_c8 = ptr_00;
            local_c0 = ptr;
            local_d0 = uVar19;
            piVar20 = ptr;
            piVar21 = ptr_00;
            do {
              uVar11 = uVar12;
              if (matrix->type == 0) {
                uVar11 = local_1e8[uVar12];
              }
              local_a8 = uVar12 | 1;
              local_d8 = uVar12;
              if (matrix->type == 0) {
                iVar10 = local_1e8[local_a8];
              }
              else {
                uVar8 = _s1Len - 1;
                if (local_a8 < local_180) {
                  uVar8 = (uint)uVar12 | 1;
                }
                iVar10 = (int64_t)(int)uVar8;
              }
              local_b0 = matrix->matrix + uVar11 * (long)matrix->size;
              local_b8 = matrix->matrix + iVar10 * matrix->size;
              local_48 = -(ulong)((long)local_158._0_8_ < (long)local_180);
              lStack_40 = -(ulong)((long)local_158._8_8_ < (long)local_180);
              uVar11 = 0;
              lVar37 = -1;
              lVar38 = 0;
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uStack_1b0;
              auVar40 = auVar23;
              auVar44 = auVar42;
              auVar45 = auVar23;
              do {
                local_138 = local_128;
                lVar32 = (long)local_b8[piVar20[uVar11]] + auVar42._0_8_;
                uVar34 = (long)local_b0[piVar20[uVar11 + 1]] + auVar42._8_8_;
                auVar42._0_8_ = auVar44._8_8_;
                auVar42._8_8_ = piVar21[uVar11 + 1];
                lVar43 = CONCAT44(uVar4,iVar9);
                lVar39 = CONCAT44(uVar4,iVar9);
                local_80 = auVar42._0_8_ - lVar43;
                uVar35 = piVar21[uVar11 + 1] - lVar39;
                local_68._12_4_ = 0;
                local_98 = auVar45._8_8_ - local_68._0_8_;
                local_88 = local_178[uVar11 + 1] - local_68._8_8_;
                lVar16 = local_98;
                if (local_98 < local_80) {
                  lVar16 = local_80;
                }
                uVar17 = local_88;
                if ((long)local_88 < (long)uVar35) {
                  uVar17 = uVar35;
                }
                lVar43 = auVar44._0_8_ - lVar43;
                local_a0 = auVar42._0_8_ - lVar39;
                lVar39 = auVar40._0_8_ - local_68._0_8_;
                uVar41 = auVar40._8_8_ - local_68._8_8_;
                local_90 = lVar39;
                if (lVar39 < lVar43) {
                  local_90 = lVar43;
                }
                uVar15 = uVar41;
                if ((long)uVar41 < (long)local_a0) {
                  uVar15 = local_a0;
                }
                if (lVar32 < 1) {
                  lVar32 = 0;
                }
                if ((long)uVar34 < 1) {
                  uVar34 = 0;
                }
                lVar13 = local_90;
                if (local_90 < lVar32) {
                  lVar13 = lVar32;
                }
                uVar18 = uVar15;
                if ((long)uVar15 < (long)uVar34) {
                  uVar18 = uVar34;
                }
                if (lVar13 <= lVar16) {
                  lVar13 = lVar16;
                }
                if ((long)uVar18 <= (long)uVar17) {
                  uVar18 = uVar17;
                }
                auVar44._8_8_ = uVar18;
                auVar44._0_8_ = lVar13;
                auVar40._8_8_ = -(ulong)(lVar38 == -1);
                auVar40._0_8_ = -(ulong)(lVar37 == -1);
                auVar44 = ~auVar40 & auVar44;
                uVar18 = auVar44._8_8_;
                lVar13 = auVar44._0_8_;
                local_148 = (int)lVar37;
                uStack_144 = (undefined4)((ulong)lVar37 >> 0x20);
                lStack_140 = lVar38;
                if (1 < uVar11) {
                  if (lVar13 <= (long)local_118._0_8_) {
                    local_118._0_8_ = lVar13;
                  }
                  if ((long)uVar18 <= (long)local_118._8_8_) {
                    local_118._8_8_ = uVar18;
                  }
                  if (local_168 <= lVar13) {
                    local_168 = lVar13;
                  }
                  uVar22 = uVar18;
                  if ((long)uVar18 < (long)uStack_160) {
                    uVar22 = uStack_160;
                  }
                  uStack_160 = uVar22;
                }
                auVar45._8_8_ = uVar17;
                auVar45._0_8_ = lVar16;
                auVar45 = ~auVar40 & auVar45 | auVar40 & auVar23;
                piVar1 = ((ppVar7->field_4).rowcols)->score_row;
                if (uVar11 < uVar19) {
                  *(byte *)((long)piVar1 + uVar11 + local_190) =
                       (-((long)local_88 < (long)uVar35) & 0x60U |
                        -((long)uVar41 < (long)local_a0) & 0x18U |
                        ~-(uVar18 == 0) & -(uVar18 == uVar34) & 4U |
                       ~-(uVar18 == uVar34) & (-(uVar18 == auVar45._8_8_) & 3U ^ 1)) ^ 0x50;
                }
                auVar2._8_8_ = lVar38;
                auVar2._0_8_ = lVar37;
                if (uVar11 != 0 && local_a8 < local_180) {
                  *(byte *)((long)piVar1 + uVar11 + local_188) =
                       (-(local_98 < local_80) & 0x60U | -(lVar39 < lVar43) & 0x18U |
                        ~-(lVar13 == 0) & -(lVar13 == lVar32) & 4U |
                       ~-(lVar13 == lVar32) & (-(lVar13 == auVar45._0_8_) & 3U ^ 1)) ^ 0x50;
                }
                auVar24._8_8_ = uVar15;
                auVar24._0_8_ = local_90;
                auVar40 = ~auVar40 & auVar24 | auVar40 & auVar23;
                ptr_00[uVar11] = lVar13;
                local_178[uVar11] = auVar45._0_8_;
                uVar31 = (undefined4)((ulong)lVar38 >> 0x20);
                auVar25._4_4_ = uStack_144;
                auVar25._0_4_ = uStack_144;
                auVar25._8_4_ = uVar31;
                auVar25._12_4_ = uVar31;
                auVar36._8_4_ = 0xffffffff;
                auVar36._0_8_ = 0xffffffffffffffff;
                auVar36._12_4_ = 0xffffffff;
                auVar25 = auVar25 ^ auVar36;
                auVar26._0_4_ = auVar25._0_4_ >> 0x1f;
                auVar26._4_4_ = auVar25._4_4_ >> 0x1f;
                auVar26._8_4_ = auVar25._8_4_ >> 0x1f;
                auVar26._12_4_ = auVar25._12_4_ >> 0x1f;
                auVar3._8_8_ = -(ulong)((long)local_158._8_8_ < (long)local_180);
                auVar3._0_8_ = -(ulong)((long)local_158._0_8_ < (long)local_180);
                auVar46._8_8_ = -(ulong)(lVar38 < (long)uVar19);
                auVar46._0_8_ = -(ulong)(lVar37 < (long)uVar19);
                auVar46 = auVar46 & auVar26 & auVar3;
                lVar43 = local_108._0_8_;
                uVar34 = local_108._8_8_;
                auVar29._8_8_ = -(ulong)(uVar18 == uVar34);
                auVar29._0_8_ = -(ulong)(lVar13 == lVar43);
                auVar33._8_8_ = -(ulong)(uVar18 != uVar34 && (long)uVar34 <= (long)uVar18);
                auVar33._0_8_ = -(ulong)(lVar13 != lVar43 && lVar43 <= lVar13);
                auVar33 = auVar33 & auVar46;
                auVar28._8_8_ = -(ulong)(lVar38 < local_128._8_8_);
                auVar28._0_8_ = -(ulong)(lVar37 < local_128._0_8_);
                local_108 = auVar33 & auVar44 | ~auVar33 & local_108;
                auVar29 = auVar28 & auVar46 & auVar29;
                local_1a8 = auVar29 & local_158 |
                            ~auVar29 & (auVar33 & local_158 | ~auVar33 & local_1a8);
                local_128 = auVar29 & auVar2 | ~auVar29 & (auVar33 & auVar2 | ~auVar33 & local_128);
                lVar37 = lVar37 + 1;
                lVar38 = lVar38 - auVar36._8_8_;
                uVar11 = uVar11 + 1;
                piVar20 = local_c0;
                piVar21 = local_c8;
              } while (s2Len + 1 != uVar11);
              local_158._8_8_ = local_158._8_8_ + 2;
              local_158._0_8_ = local_158._0_8_ + 2;
              uVar12 = uVar12 + 2;
              local_190 = local_190 + local_e8;
              local_188 = local_188 + local_e8;
            } while (uVar12 < local_180);
          }
          lVar37 = 0;
          iVar6 = 0;
          iVar9 = 0;
          do {
            lVar38 = *(long *)(local_108 + lVar37 * 8);
            if (lVar14 < lVar38) {
              iVar6 = *(int *)(local_1a8 + lVar37 * 8);
              lVar14 = lVar38;
              iVar9 = *(int *)(local_128 + lVar37 * 8);
            }
            else if (lVar38 == lVar14) {
              lVar38 = *(long *)(local_128 + lVar37 * 8);
              if (lVar38 < iVar9) {
                iVar6 = *(int *)(local_1a8 + lVar37 * 8);
                iVar9 = (int)lVar38;
              }
              else if ((lVar38 == iVar9) && (*(long *)(local_1a8 + lVar37 * 8) < (long)iVar6)) {
                iVar6 = (int)*(long *)(local_1a8 + lVar37 * 8);
                iVar9 = (int)lVar38;
              }
            }
            lVar37 = lVar37 + 1;
          } while ((int)lVar37 == 1);
          auVar27._8_8_ = -(ulong)((long)local_118._8_8_ <= (long)local_f0);
          auVar27._0_8_ = -(ulong)((long)local_118._0_8_ <= (long)local_f0);
          auVar30._8_8_ = -(ulong)(local_f8 < (long)uStack_160);
          auVar30._0_8_ = -(ulong)(local_f8 < local_168);
          auVar30 = auVar30 | auVar27;
          if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar30 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar30 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar30 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar30 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar30 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar30 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar30 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar30 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar30[0xf] < '\0') {
            *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
            lVar14 = 0;
            iVar9 = 0;
            iVar6 = 0;
          }
          ppVar7->score = (int)lVar14;
          ppVar7->end_query = iVar6;
          ppVar7->end_ref = iVar9;
          local_68 = auVar5;
          parasail_free(local_178);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_1e8);
            return ppVar7;
          }
          return ppVar7;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;
    __m128i vTDiag;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTZero;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }
        
    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vTDiag = _mm_set1_epi64x_rpl(PARASAIL_DIAG);
    vTIns = _mm_set1_epi64x_rpl(PARASAIL_INS);
    vTDel = _mm_set1_epi64x_rpl(PARASAIL_DEL);
    vTZero = _mm_set1_epi64x_rpl(PARASAIL_ZERO);
    vTDiagE = _mm_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vNWH = _mm_max_epi64_rpl(vNWH, vZero);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
            /* trace table */
            {
                __m128i cond_zero = _mm_cmpeq_epi64_rpl(vWH, vZero);
                __m128i case1 = _mm_cmpeq_epi64_rpl(vWH, vNWH);
                __m128i case2 = _mm_cmpeq_epi64_rpl(vWH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                __m128i condE = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
                __m128i condF = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
                __m128i vET = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, condE);
                __m128i vFT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, condF);
                vT = _mm_or_si128(vT, vET);
                vT = _mm_or_si128(vT, vFT);
                arr_store_si128(result->trace->trace_table, vT, i, s1Len, j, s2Len);
            }
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64_rpl(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}